

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QDockAreaLayoutInfo * __thiscall
QDockAreaLayoutInfo::info(QDockAreaLayoutInfo *this,QWidget *widget)

{
  QDockAreaLayoutItem *this_00;
  QDockAreaLayoutItem *pQVar1;
  QLayoutItem *pQVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  QDockAreaLayoutInfo *pQVar5;
  long lVar6;
  int i;
  ulong uVar7;
  
  lVar6 = 0;
  uVar7 = 0;
  do {
    if ((ulong)(this->item_list).d.size <= uVar7) {
      return (QDockAreaLayoutInfo *)0x0;
    }
    pQVar1 = (this->item_list).d.ptr;
    this_00 = (QDockAreaLayoutItem *)((long)&pQVar1->widgetItem + lVar6);
    bVar3 = QDockAreaLayoutItem::skip(this_00);
    if (!bVar3) {
      if ((this->tabbed == true) && (&this->tabBar->super_QWidget == widget)) {
        return this;
      }
      pQVar2 = this_00->widgetItem;
      if ((pQVar2 != (QLayoutItem *)0x0) &&
         (iVar4 = (*pQVar2->_vptr_QLayoutItem[0xd])(),
         (QWidget *)CONCAT44(extraout_var,iVar4) == widget)) {
        return this;
      }
      pQVar5 = *(QDockAreaLayoutInfo **)((long)&pQVar1->subinfo + lVar6);
      if ((pQVar5 != (QDockAreaLayoutInfo *)0x0) &&
         (pQVar5 = info(pQVar5,widget), pQVar5 != (QDockAreaLayoutInfo *)0x0)) {
        return pQVar5;
      }
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x28;
  } while( true );
}

Assistant:

QDockAreaLayoutInfo *QDockAreaLayoutInfo::info(QWidget *widget)
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

#if QT_CONFIG(tabbar)
        if (tabbed && widget == tabBar)
            return this;
#endif

        if (item.widgetItem != nullptr && item.widgetItem->widget() == widget)
            return this;

        if (item.subinfo != nullptr) {
            if (QDockAreaLayoutInfo *result = item.subinfo->info(widget))
                return result;
        }
    }

    return nullptr;
}